

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O1

_Bool use_option_context_menu(menu *m,ui_event *in,ui_event *out)

{
  _Bool _Var1;
  int page;
  int iVar2;
  char *pcVar3;
  menu *m_00;
  char dummy;
  char save_label [40];
  char local_59;
  char local_58 [40];
  
  page = option_type(*m->filter_list);
  pcVar3 = string_make("abcdefghijklmnopqrstuvwxyz");
  m_00 = menu_dynamic_new();
  m_00->selections = pcVar3;
  option_type_name(page);
  strnfmt(local_58,0x28,"Save as default %s options");
  menu_dynamic_add_label(m_00,local_58,'s',0,pcVar3);
  if (m->flags == 0x10) {
    menu_dynamic_add_label(m_00,"Restore from saved defaults",'r',1,pcVar3);
    menu_dynamic_add_label(m_00,"Reset to factory defaults",'x',2,pcVar3);
  }
  screen_save();
  if (in->type != EVT_MOUSE) {
    __assert_fail("in->type == EVT_MOUSE",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-options.c"
                  ,0x105,
                  "_Bool use_option_context_menu(struct menu *, const ui_event *, ui_event *)");
  }
  menu_dynamic_calc_location(m_00,(uint)(in->mouse).x,(uint)(in->mouse).y);
  region_erase_bordered((region_conflict *)&m_00->boundary);
  iVar2 = menu_dynamic_select(m_00);
  menu_dynamic_free(m_00);
  string_free(pcVar3);
  if (iVar2 == 2) {
    options_restore_maintainer(&player->opts,page);
LAB_001e14da:
    screen_load();
    menu_refresh(m,false);
    return true;
  }
  if (iVar2 == 1) {
    _Var1 = options_restore_custom(&player->opts,page);
    if (_Var1) goto LAB_001e14da;
    pcVar3 = "Restore failed.  Press any key to continue.";
  }
  else {
    if (iVar2 != 0) goto LAB_001e14bd;
    _Var1 = options_save_custom(&player->opts,page);
    pcVar3 = "Save failed.  Press any key to continue.";
    if (_Var1) {
      pcVar3 = "Successfully saved.  Press any key to continue.";
    }
  }
  get_com(pcVar3,&local_59);
LAB_001e14bd:
  screen_load();
  return true;
}

Assistant:

static bool use_option_context_menu(struct menu *m, const ui_event *in,
		ui_event *out)
{
	enum {
		ACT_CTX_OPT_SAVE,
		ACT_CTX_OPT_RESTORE,
		ACT_CTX_OPT_RESET
	};
	/*
	 * As a bit of a hack, get the type of options involved from the first
	 * option selected by the menu's filter.
	 */
	int page = option_type(m->filter_list[0]);
	char *labels = string_make(lower_case);
	struct menu *cm = menu_dynamic_new();
	bool refresh = false;
	char save_label[40];
	int selected;
	char dummy;

	cm->selections = labels;
	strnfmt(save_label, sizeof(save_label), "Save as default %s options",
		option_type_name(page));
	menu_dynamic_add_label(cm, save_label, 's', ACT_CTX_OPT_SAVE, labels);
	if (m->flags == MN_DBL_TAP) {
		menu_dynamic_add_label(cm, "Restore from saved defaults", 'r',
			ACT_CTX_OPT_RESTORE, labels);
		menu_dynamic_add_label(cm, "Reset to factory defaults", 'x',
			ACT_CTX_OPT_RESET, labels);
	}

	screen_save();

	assert(in->type == EVT_MOUSE);
	menu_dynamic_calc_location(cm, in->mouse.x, in->mouse.y);
	region_erase_bordered(&cm->boundary);

	selected = menu_dynamic_select(cm);

	menu_dynamic_free(cm);
	string_free(labels);

	switch (selected) {
	case ACT_CTX_OPT_SAVE:
		if (options_save_custom(&player->opts, page)) {
			get_com("Successfully saved.  Press any key to "
				"continue.", &dummy);
		} else {
			get_com("Save failed.  Press any key to continue.",
				&dummy);
		}
		break;

	case ACT_CTX_OPT_RESTORE:
		if (options_restore_custom(&player->opts, page)) {
			refresh = true;
		} else {
			get_com("Restore failed.  Press any key to continue.",
				&dummy);
		}
		break;

	case ACT_CTX_OPT_RESET:
		options_restore_maintainer(&player->opts, page);
		refresh = true;
		break;

	default:
		/* There's nothing to do. */
		break;
	}

	screen_load();
	if (refresh) {
		menu_refresh(m, false);
	}

	return true;
}